

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

HighsInt __thiscall
HighsOrbitopeMatrix::orbitalFixing(HighsOrbitopeMatrix *this,HighsDomain *domain)

{
  int *piVar1;
  HighsInt HVar2;
  ValueType *__x;
  int *piVar3;
  bool bVar4;
  vector<int,_std::allocator<int>_> rows;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rowUsed;
  allocator_type local_69;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(long)this->numRows,
             &local_69);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)&local_68,(long)this->numRows);
  piVar1 = (domain->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar4 = true;
  for (piVar3 = (domain->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    __x = HighsHashTable<int,_int>::find
                    (&this->columnToRow,
                     &(domain->domchgstack_).
                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                      _M_impl.super__Vector_impl_data._M_start[*piVar3].column);
    if ((__x != (ValueType *)0x0) &&
       (local_48._M_impl.super__Vector_impl_data._M_start[*__x] == '\0')) {
      local_48._M_impl.super__Vector_impl_data._M_start[*__x] = '\x01';
      if (bVar4) {
        bVar4 = (this->rowIsSetPacking).
                super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start[*__x] != '\0';
      }
      else {
        bVar4 = false;
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_68,__x);
    }
  }
  if (local_68._M_impl.super__Vector_impl_data._M_start ==
      local_68._M_impl.super__Vector_impl_data._M_finish) {
    HVar2 = 0;
  }
  else if (bVar4) {
    HVar2 = orbitalFixingForPackingOrbitope
                      (this,(vector<int,_std::allocator<int>_> *)&local_68,domain);
  }
  else {
    HVar2 = orbitalFixingForFullOrbitope(this,(vector<int,_std::allocator<int>_> *)&local_68,domain)
    ;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return HVar2;
}

Assistant:

HighsInt HighsOrbitopeMatrix::orbitalFixing(HighsDomain& domain) const {
  std::vector<HighsInt> rows;
  std::vector<uint8_t> rowUsed(numRows);

  rows.reserve(numRows);

  const auto& branchpos = domain.getBranchingPositions();
  const auto& domchgstack = domain.getDomainChangeStack();

  bool isPacking = true;
  for (HighsInt pos : branchpos) {
    const HighsInt* i = columnToRow.find(domchgstack[pos].column);
    if (i && !rowUsed[*i]) {
      rowUsed[*i] = true;
      isPacking = isPacking && rowIsSetPacking[*i] != 0;
      rows.push_back(*i);
    }
  }

  if (rows.empty()) return 0;

  if (isPacking) return orbitalFixingForPackingOrbitope(rows, domain);

  return orbitalFixingForFullOrbitope(rows, domain);
}